

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall Dice::rollDice(Dice *this)

{
  int iVar1;
  mapped_type *pmVar2;
  int iVar3;
  bool bVar4;
  DiceOptions value;
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  local_58;
  
  iVar3 = 6;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    iVar1 = rand();
    value = iVar1 % 6;
    pmVar2 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](&this->DiceValues,&value);
    *pmVar2 = *pmVar2 + 1;
  }
  resolveDuringHand(this);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::_Rb_tree(&local_58,&(this->DiceValues)._M_t);
  std::
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ::push_back(&this->historyOfRolls,(value_type *)&local_58);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~_Rb_tree(&local_58);
  resetDiceValuesMap(this);
  this->numberOfRolls = this->numberOfRolls + -1;
  return;
}

Assistant:

void Dice::rollDice(){
    DiceOptions value;
    for(int i=0; i<6; i++)
    {
        value = randomDiceOption();
        this->DiceValues[value] ++;
    }

    resolveDuringHand();

    storeDiceResult(DiceValues);
    resetDiceValuesMap();
    this->numberOfRolls--;
}